

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O3

String * __thiscall
capnp::JsonCodec::encode<double>(String *__return_storage_ptr__,JsonCodec *this,double *value)

{
  Reader local_50;
  
  local_50.field_1.floatValue = *value;
  local_50.type = FLOAT;
  encode(__return_storage_ptr__,this,&local_50,(Type)ZEXT816(0xb));
  DynamicValue::Reader::~Reader(&local_50);
  return __return_storage_ptr__;
}

Assistant:

kj::String JsonCodec::encode(T&& value) const {
  Type type = Type::from(value);
  typedef FromAny<kj::Decay<T>> Base;
  return encode(DynamicValue::Reader(ReaderFor<Base>(kj::fwd<T>(value))), type);
}